

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  cmExportSet *pcVar1;
  cmMakefile *this_00;
  cmInstallExportGenerator *pcVar2;
  pointer pcVar3;
  cmGeneratorTarget *this_01;
  _Alloc_hider __s1;
  ulong uVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  TargetType TVar10;
  PolicyStatus PVar11;
  undefined8 *puVar12;
  char *pcVar13;
  ostream *poVar14;
  long *plVar15;
  string *psVar16;
  uint uVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  char *pcVar20;
  char *versionString;
  pointer ppcVar21;
  cmExportInstallFileGenerator *pcVar22;
  undefined8 uVar23;
  pointer config;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar24;
  string sep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  string installPrefix;
  cmTargetExport *te;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  ostream *local_258;
  cmExportInstallFileGenerator *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  uint local_21c;
  string local_218;
  undefined1 local_1f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  cmTargetExport **local_1c8;
  undefined8 local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Base_ptr local_188;
  size_t local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [16];
  ulong uVar17;
  
  local_1d8._M_allocated_capacity = 0;
  local_1d8._8_8_ = (cmTargetExport **)0x0;
  local_1c8 = (cmTargetExport **)0x0;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->IEGen->ExportSet;
  ppcVar21 = (pcVar1->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_258 = os;
  local_250 = this;
  if (ppcVar21 !=
      (pcVar1->TargetExports).
      super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::operator+(&local_248,&local_278,&(this->super_cmExportFileGenerator).Namespace);
      cmGeneratorTarget::GetExportName_abi_cxx11_((string *)local_1f8,(*ppcVar21)->Target);
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        uVar23 = local_248.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar23 < local_248._M_string_length + local_1f8._8_8_) {
        uVar17 = 0xf;
        if ((cmTargetExport *)local_1f8._0_8_ != (cmTargetExport *)(local_1f8 + 0x10)) {
          uVar17 = local_1f8._16_8_;
        }
        if (uVar17 < local_248._M_string_length + local_1f8._8_8_) goto LAB_003ac439;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)local_1f8,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
      }
      else {
LAB_003ac439:
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,local_1f8._0_8_);
      }
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 == paVar19) {
        local_198._M_allocated_capacity = paVar19->_M_allocated_capacity;
        local_198._8_8_ = puVar12[3];
        local_1a8._0_8_ = &local_198;
      }
      else {
        local_198._M_allocated_capacity = paVar19->_M_allocated_capacity;
        local_1a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar12;
      }
      local_1a8._8_8_ = puVar12[1];
      *puVar12 = paVar19;
      puVar12[1] = 0;
      paVar19->_M_local_buf[0] = '\0';
      std::__cxx11::string::_M_append((char *)&local_218,local_1a8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
      }
      if ((cmTargetExport *)local_1f8._0_8_ != (cmTargetExport *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_278,0,(char *)local_278._M_string_length,0x501c1e);
      local_1f8._0_8_ = *ppcVar21;
      pVar24 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>
                         ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                           *)&(this->super_cmExportFileGenerator).ExportedTargets,
                          &((cmTargetExport *)local_1f8._0_8_)->Target);
      if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"install(EXPORT \"",0x10);
        pcVar1 = local_250->IEGen->ExportSet;
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(pcVar1->Name)._M_dataplus._M_p,
                             (pcVar1->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" ...) ",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"includes target \"",0x11);
        psVar16 = cmGeneratorTarget::GetName_abi_cxx11_
                            (*(cmGeneratorTarget **)(local_1f8._0_8_ + 0x20));
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14,(psVar16->_M_dataplus)._M_p,psVar16->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\" more than once in the export set.",0x23);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Error(local_248._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)local_138[0]._M_local_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,
                          CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                   local_218.field_2._M_local_buf[0]) + 1);
        }
        bVar5 = false;
        goto LAB_003ad14c;
      }
      if ((cmTargetExport **)local_1d8._8_8_ == local_1c8) {
        std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>::
        _M_realloc_insert<cmTargetExport*const&>
                  ((vector<cmTargetExport*,std::allocator<cmTargetExport*>> *)local_1d8._M_local_buf
                   ,(iterator)local_1d8._8_8_,(cmTargetExport **)local_1f8);
      }
      else {
        *(undefined8 *)local_1d8._8_8_ = local_1f8._0_8_;
        local_1d8._8_8_ = local_1d8._8_8_ + 8;
      }
      ppcVar21 = ppcVar21 + 1;
    } while (ppcVar21 !=
             (local_250->IEGen->ExportSet->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pcVar22 = local_250;
  cmExportFileGenerator::GenerateExpectedTargetsCode
            (&local_250->super_cmExportFileGenerator,local_258,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,
                    CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                             local_278.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                             local_218.field_2._M_local_buf[0]) + 1);
  }
  this_00 = pcVar22->IEGen->LocalGenerator->Makefile;
  local_1a8._0_8_ = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_INSTALL_PREFIX","");
  pcVar13 = cmMakefile::GetSafeDefinition(this_00,(string *)local_1a8);
  std::__cxx11::string::string((string *)&local_218,pcVar13,(allocator *)&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
  }
  pcVar2 = pcVar22->IEGen;
  bVar5 = cmsys::SystemTools::FileIsFullPath(&(pcVar2->super_cmInstallGenerator).Destination);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_258,
               "# The installation prefix configured by this project.\nset(_IMPORT_PREFIX \"",0x4a);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_258,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\")\n\n",4);
  }
  else {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,local_218._M_dataplus._M_p,
               local_218._M_dataplus._M_p + local_218._M_string_length);
    std::__cxx11::string::append((char *)&local_278);
    plVar15 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_278,
                                 (ulong)(pcVar2->super_cmInstallGenerator).Destination._M_dataplus.
                                        _M_p);
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 == paVar19) {
      local_198._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_198._8_8_ = plVar15[3];
      local_1a8._0_8_ = &local_198;
    }
    else {
      local_198._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_1a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar15;
    }
    local_1a8._8_8_ = plVar15[1];
    *plVar15 = (long)paVar19;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,
                      CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                               local_278.field_2._M_local_buf[0]) + 1);
    }
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,local_1a8._0_8_,(char *)(local_1a8._0_8_ + local_1a8._8_8_));
    std::__cxx11::string::append((char *)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_258,"# Compute the installation prefix relative to this file.\n",0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_258,"get_filename_component(_IMPORT_PREFIX",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_258," \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n",0x24);
    __s1._M_p = local_278._M_dataplus._M_p;
    iVar8 = strncmp(local_278._M_dataplus._M_p,"/lib/",5);
    if ((((iVar8 == 0) || (iVar8 = strncmp(__s1._M_p,"/lib64/",7), iVar8 == 0)) ||
        (iVar8 = strncmp(__s1._M_p,"/usr/lib/",9), iVar8 == 0)) ||
       (iVar8 = strncmp(__s1._M_p,"/usr/lib64/",0xb), iVar8 == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_258,
                 "# Use original install prefix when loaded through a\n# cross-prefix symbolic link such as /lib -> /usr/lib.\nget_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\nget_filename_component(_realOrig \""
                 ,0xcc);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_258,(char *)local_1a8._0_8_,local_1a8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"\" REALPATH)\nif(_realCurr STREQUAL _realOrig)\n  set(_IMPORT_PREFIX \"",
                 0x43);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,(char *)local_1a8._0_8_,local_1a8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"\")\nendif()\nunset(_realOrig)\nunset(_realCurr)\n",0x2d);
    }
    pcVar3 = (pcVar2->super_cmInstallGenerator).Destination._M_dataplus._M_p;
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,pcVar3,
               pcVar3 + (pcVar2->super_cmInstallGenerator).Destination._M_string_length);
    if (local_248._M_string_length != 0) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_258,"get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n",
                   0x40);
        cmsys::SystemTools::GetFilenamePath((string *)local_1f8,&local_248);
        std::__cxx11::string::operator=((string *)&local_248,(string *)local_1f8);
        if ((cmTargetExport *)local_1f8._0_8_ != (cmTargetExport *)(local_1f8 + 0x10)) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
      } while (local_248._M_string_length != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_258,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,
                      CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                               local_278.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
    }
  }
  local_248._M_dataplus._M_p = (char *)0x0;
  local_248._M_string_length = 0;
  local_248.field_2._M_allocated_capacity = 0;
  if (local_1d8._M_allocated_capacity == local_1d8._8_8_) {
    local_21c = 0;
    pcVar22 = local_250;
    poVar14 = local_258;
  }
  else {
    uVar17 = 0;
    local_1b8 = 0;
    local_1c0 = 0;
    uVar23 = local_1d8._M_allocated_capacity;
    uVar18 = 0;
    do {
      pcVar22 = local_250;
      this_01 = (*(cmTargetExport **)uVar23)->Target;
      uVar9 = (uint)CONCAT71((int7)((ulong)*(cmTargetExport **)uVar23 >> 8),1);
      if ((uVar18 & 1) == 0) {
        TVar10 = cmGeneratorTarget::GetType(this_01);
        uVar9 = CONCAT31((int3)(TVar10 >> 8),TVar10 != INTERFACE_LIBRARY);
      }
      local_21c = uVar9;
      cmExportFileGenerator::GenerateImportTargetCode
                (&pcVar22->super_cmExportFileGenerator,local_258,this_01);
      local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
      local_198._M_allocated_capacity = 0;
      local_198._8_8_ = local_1a8 + 8;
      local_180 = 0;
      local_1b0 = uVar17;
      local_188 = (_Base_ptr)local_198._8_8_;
      cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                (&pcVar22->super_cmExportFileGenerator,*(cmTargetExport **)uVar23,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_248);
      cmExportFileGenerator::PopulateSourcesInterface
                (&pcVar22->super_cmExportFileGenerator,*(cmTargetExport **)uVar23,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_248);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&pcVar22->super_cmExportFileGenerator,&local_278,this_01,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                 local_278.field_2._M_local_buf[0]) + 1);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,"INTERFACE_COMPILE_DEFINITIONS","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&pcVar22->super_cmExportFileGenerator,&local_278,this_01,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                 local_278.field_2._M_local_buf[0]) + 1);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,"INTERFACE_COMPILE_OPTIONS","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&pcVar22->super_cmExportFileGenerator,&local_278,this_01,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                 local_278.field_2._M_local_buf[0]) + 1);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,"INTERFACE_AUTOUIC_OPTIONS","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&pcVar22->super_cmExportFileGenerator,&local_278,this_01,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                 local_278.field_2._M_local_buf[0]) + 1);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,"INTERFACE_COMPILE_FEATURES","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&pcVar22->super_cmExportFileGenerator,&local_278,this_01,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                 local_278.field_2._M_local_buf[0]) + 1);
      }
      PVar11 = cmPolicies::PolicyMap::Get(&this_01->PolicyMap,CMP0022);
      if (((PVar11 != WARN) &&
          (PVar11 = cmPolicies::PolicyMap::Get(&this_01->PolicyMap,CMP0022), PVar11 != OLD)) &&
         (bVar5 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                            (&local_250->super_cmExportFileGenerator,this_01,InstallInterface,
                             (ImportPropertyMap *)local_1a8,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_248), bVar5)) {
        local_1c0 = CONCAT71((int7)((ulong)local_1c0 >> 8),
                             (byte)local_1c0 |
                             (local_250->super_cmExportFileGenerator).ExportOld ^ 1U);
      }
      TVar10 = cmGeneratorTarget::GetType(this_01);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"INTERFACE_SOURCES","");
      pcVar13 = cmGeneratorTarget::GetProperty(this_01,&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                 local_278.field_2._M_local_buf[0]) + 1);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,"INTERFACE_POSITION_INDEPENDENT_CODE","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&local_250->super_cmExportFileGenerator,&local_278,this_01,
                 (ImportPropertyMap *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                 local_278.field_2._M_local_buf[0]) + 1);
      }
      cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                (&local_250->super_cmExportFileGenerator,this_01,(ImportPropertyMap *)local_1a8);
      cmExportFileGenerator::GenerateInterfaceProperties
                (&local_250->super_cmExportFileGenerator,this_01,local_258,
                 (ImportPropertyMap *)local_1a8);
      uVar4 = local_1b0;
      local_1b8 = CONCAT71((int7)(local_1b8 >> 8),(byte)local_1b8 | TVar10 == INTERFACE_LIBRARY);
      bVar6 = (byte)local_1b0 | pcVar13 != (char *)0x0;
      uVar17 = CONCAT71((int7)(local_1b0 >> 8),bVar6);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1a8);
      pcVar22 = local_250;
      poVar14 = local_258;
      uVar23 = uVar23 + 8;
      uVar18 = local_21c;
    } while (uVar23 != local_1d8._8_8_);
    if (((bVar6 | (byte)local_1b8 | (byte)local_1c0) & 1) != 0) {
      pcVar20 = "2.8.12";
      if ((local_1b8 & 1) != 0) {
        pcVar20 = "3.0.0";
      }
      versionString = "3.1.0";
      if ((uVar4 & 1) == 0 && pcVar13 == (char *)0x0) {
        versionString = pcVar20;
      }
      cmExportFileGenerator::GenerateRequiredCMakeVersion
                (&local_250->super_cmExportFileGenerator,local_258,versionString);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,"# Load information for each installed configuration.\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,"get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,"file(GLOB CONFIG_FILES \"${_DIR}/",0x20);
  GetConfigImportFileGlob_abi_cxx11_((string *)local_1a8,pcVar22);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_258,(char *)local_1a8._0_8_,local_1a8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\")\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"foreach(f ${CONFIG_FILES})\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"  include(${f})\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"endforeach()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
  }
  poVar14 = local_258;
  std::__ostream_insert<char,std::char_traits<char>>
            (local_258,"# Cleanup temporary variables.\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"set(_IMPORT_PREFIX)\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
  cmExportFileGenerator::GenerateImportedFileCheckLoop
            (&pcVar22->super_cmExportFileGenerator,poVar14);
  bVar5 = true;
  if (((char)local_21c != '\0') &&
     (config = (pcVar22->super_cmExportFileGenerator).Configurations.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     config != (pcVar22->super_cmExportFileGenerator).Configurations.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar5 = true;
    do {
      bVar7 = GenerateImportFileConfig
                        (pcVar22,config,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_248);
      bVar5 = (bool)(bVar5 & bVar7);
      config = config + 1;
    } while (config != (pcVar22->super_cmExportFileGenerator).Configurations.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmExportFileGenerator::GenerateMissingTargetsCheckCode
            (&pcVar22->super_cmExportFileGenerator,local_258,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                             local_218.field_2._M_local_buf[0]) + 1);
  }
LAB_003ad14c:
  if ((cmTargetExport **)local_1d8._M_allocated_capacity != (cmTargetExport **)0x0) {
    operator_delete((void *)local_1d8._M_allocated_capacity,(long)local_1c8 - local_1d8._0_8_);
  }
  return bVar5;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
  std::string expectedTargets;
  std::string sep;
  for(std::vector<cmTargetExport*>::const_iterator
        tei = this->IEGen->GetExportSet()->GetTargetExports()->begin();
      tei != this->IEGen->GetExportSet()->GetTargetExports()->end(); ++tei)
    {
    expectedTargets +=
        sep + this->Namespace + (*tei)->Target->GetExportName();
    sep = " ";
    cmTargetExport * te = *tei;
    if(this->ExportedTargets.insert(te->Target).second)
      {
      allTargets.push_back(te);
      }
    else
      {
      std::ostringstream e;
      e << "install(EXPORT \""
        << this->IEGen->GetExportSet()->GetName()
        << "\" ...) " << "includes target \"" << te->Target->GetName()
        << "\" more than once in the export set.";
      cmSystemTools::Error(e.str().c_str());
      return false;
      }
    }

  this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Set an _IMPORT_PREFIX variable for import location properties
  // to reference if they are relative to the install prefix.
  std::string installPrefix = this->IEGen->GetLocalGenerator()
      ->GetMakefile()->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
  std::string const& expDest = this->IEGen->GetDestination();
  if(cmSystemTools::FileIsFullPath(expDest))
    {
    // The export file is being installed to an absolute path so the
    // package is not relocatable.  Use the configured install prefix.
    os <<
      "# The installation prefix configured by this project.\n"
      "set(_IMPORT_PREFIX \"" << installPrefix << "\")\n"
      "\n";
    }
  else
    {
    // Add code to compute the installation prefix relative to the
    // import file location.
    std::string absDest = installPrefix + "/" + expDest;
    std::string absDestS = absDest + "/";
    os << "# Compute the installation prefix relative to this file.\n"
       << "get_filename_component(_IMPORT_PREFIX"
       << " \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n";
    if(cmHasLiteralPrefix(absDestS.c_str(), "/lib/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/lib64/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib64/"))
      {
      // Handle "/usr move" symlinks created by some Linux distros.
      os <<
        "# Use original install prefix when loaded through a\n"
        "# cross-prefix symbolic link such as /lib -> /usr/lib.\n"
        "get_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\n"
        "get_filename_component(_realOrig \"" << absDest << "\" REALPATH)\n"
        "if(_realCurr STREQUAL _realOrig)\n"
        "  set(_IMPORT_PREFIX \"" << absDest << "\")\n"
        "endif()\n"
        "unset(_realOrig)\n"
        "unset(_realCurr)\n";
      }
    std::string dest = expDest;
    while(!dest.empty())
      {
      os <<
        "get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n";
      dest = cmSystemTools::GetFilenamePath(dest);
      }
    os << "\n";
    }

  std::vector<std::string> missingTargets;

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for(std::vector<cmTargetExport*>::const_iterator
        tei = allTargets.begin();
      tei != allTargets.end(); ++tei)
    {
    cmGeneratorTarget* gt = (*tei)->Target;

    requiresConfigFiles = requiresConfigFiles
                              || gt->GetType() != cmState::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(*tei,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateSourcesInterface(*tei,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);

    const bool newCMP0022Behavior =
        gt->GetPolicyStatusCMP0022() != cmPolicies::WARN
        && gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior)
      {
      if (this->PopulateInterfaceLinkLibrariesProperty(gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets)
          && !this->ExportOld)
        {
        require2_8_12 = true;
        }
      }
    if (gt->GetType() == cmState::INTERFACE_LIBRARY)
      {
      require3_0_0 = true;
      }
    if(gt->GetProperty("INTERFACE_SOURCES"))
      {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
      }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE",
                                  gt, properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);
    }

  if (require3_1_0)
    {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
    }
  else if (require3_0_0)
    {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
    }
  else if (require2_8_12)
    {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
    }

  // Now load per-configuration properties for them.
  os << "# Load information for each installed configuration.\n"
     << "get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n"
     << "file(GLOB CONFIG_FILES \"${_DIR}/"
     << this->GetConfigImportFileGlob() << "\")\n"
     << "foreach(f ${CONFIG_FILES})\n"
     << "  include(${f})\n"
     << "endforeach()\n"
     << "\n";

  // Cleanup the import prefix variable.
  os << "# Cleanup temporary variables.\n"
     << "set(_IMPORT_PREFIX)\n"
     << "\n";
  this->GenerateImportedFileCheckLoop(os);

  bool result = true;
  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles)
    {
    for(std::vector<std::string>::const_iterator
          ci = this->Configurations.begin();
        ci != this->Configurations.end(); ++ci)
      {
      if(!this->GenerateImportFileConfig(*ci, missingTargets))
        {
        result = false;
        }
      }
    }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return result;
}